

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

void __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,std::__cxx11::string>,absl::lts_20250127::hash_internal::Hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
::
emplace_at<std::piecewise_construct_t_const&,std::tuple<int&&>,std::tuple<std::basic_string_view<char,std::char_traits<char>>&&>>
          (raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,std::__cxx11::string>,absl::lts_20250127::hash_internal::Hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
           *this,iterator iter,piecewise_construct_t *args,tuple<int_&&> *args_1,
          tuple<std::basic_string_view<char,_std::char_traits<char>_>_&&> *args_2)

{
  size_t c;
  basic_string_view<char,_std::char_traits<char>_> *pbVar1;
  char *pcVar2;
  size_t sVar3;
  bool bVar4;
  reference key_00;
  ulong uVar5;
  int *key;
  iterator local_48;
  iterator local_38;
  iterator local_28;
  
  local_38.field_1 = iter.field_1;
  local_38.ctrl_ = iter.ctrl_;
  c = *(size_t *)this;
  *(undefined8 *)this = 0xffffffffffffff9c;
  pbVar1 = (args_2->super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>_&&>
           ).super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>_&&,_false>.
           _M_head_impl;
  *(int *)local_38.field_1.slot_ =
       *(args_1->super__Tuple_impl<0UL,_int_&&>).super__Head_base<0UL,_int_&&,_false>._M_head_impl;
  pcVar2 = pbVar1->_M_str;
  sVar3 = pbVar1->_M_len;
  *(int **)((long)local_38.field_1.slot_ + 8) = (int *)((long)local_38.field_1.slot_ + 0x18);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)local_38.field_1.slot_ + 8),pcVar2,pcVar2 + sVar3);
  CommonFields::set_capacity((CommonFields *)this,c);
  key_00 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::iterator::operator*(&local_38);
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::AssertNotDebugCapacity
            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)this);
  uVar5 = ((ulong)(uint)key_00->first ^ (ulong)&hash_internal::MixingHashState::kSeed) *
          -0x234dd359734ecb13;
  local_28 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::find_non_soo<int>((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)this,&key_00->first,
                                 uVar5 >> 0x38 | (uVar5 & 0xff000000000000) >> 0x28 |
                                 (uVar5 & 0xff0000000000) >> 0x18 | (uVar5 & 0xff00000000) >> 8 |
                                 (uVar5 & 0xff000000) << 8 | (uVar5 & 0xff0000) << 0x18 |
                                 (uVar5 & 0xff00) << 0x28 | uVar5 << 0x38);
  local_48.ctrl_ = local_38.ctrl_;
  local_48.field_1 = local_38.field_1;
  bVar4 = container_internal::operator==(&local_28,&local_48);
  if (bVar4) {
    return;
  }
  __assert_fail("PolicyTraits::apply(FindElement{*this}, *iter) == iter && \"constructed value does not match the lookup key\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0xfe2,
                "void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<int, std::basic_string<char>>, absl::hash_internal::Hash<int>, std::equal_to<int>, std::allocator<std::pair<const int, std::basic_string<char>>>>::emplace_at(iterator, Args &&...) [Policy = absl::container_internal::FlatHashMapPolicy<int, std::basic_string<char>>, Hash = absl::hash_internal::Hash<int>, Eq = std::equal_to<int>, Alloc = std::allocator<std::pair<const int, std::basic_string<char>>>, Args = <const std::piecewise_construct_t &, std::tuple<int &&>, std::tuple<std::basic_string_view<char> &&>>]"
               );
}

Assistant:

void emplace_at(iterator iter, Args&&... args) {
    construct(iter.slot(), std::forward<Args>(args)...);

    assert(PolicyTraits::apply(FindElement{*this}, *iter) == iter &&
           "constructed value does not match the lookup key");
  }